

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O3

int parse_commandline(int argc,char **argv,oonf_appdata *appdata,_Bool reload_only)

{
  int iVar1;
  cfg_db *pcVar2;
  ulong uVar3;
  cfg_instance *pcVar4;
  oonf_subsystem *poVar5;
  cfg_db *pcVar6;
  undefined8 *puVar7;
  list_entity *plVar8;
  undefined7 in_register_00000009;
  _func_int_char_ptr *p_Var9;
  byte bVar10;
  uint uVar12;
  FILE *__stream;
  char *pcVar13;
  list_entity *plVar14;
  int opt_idx;
  autobuf log;
  ulong uVar11;
  
  pcVar2 = oonf_cfg_get_rawdb();
  _optind = 1;
  _opterr = _ignore_unknown - 1;
  abuf_init(&log);
  pcVar13 = "-hvp:ql:S:s:r:g::f:n";
  if ((int)CONCAT71(in_register_00000009,reload_only) != 0) {
    pcVar13 = "-p:l:s:r:f:n";
  }
  uVar3 = getopt_long(argc,argv,pcVar13,oonf_options);
  uVar11 = uVar3 >> 0x1f & 1;
  bVar10 = (byte)uVar11;
  uVar12 = 0xffffffff;
  if (-1 < (int)uVar3) {
    do {
      bVar10 = (byte)uVar11;
      iVar1 = (int)uVar3;
      if (0xff < iVar1) {
        if (1 < iVar1 - 0x101U) {
          if (iVar1 != 0x100) goto switchD_0010661d_caseD_69;
          _schema_name = _optarg;
          _display_schema = 1;
        }
        goto LAB_00106765;
      }
      switch(iVar1) {
      case 0x67:
        pcVar4 = oonf_cfg_get_instance();
        iVar1 = cfg_cmd_handle_get(pcVar4,pcVar2,_optarg,&log);
        uVar12 = (uint)(iVar1 != 0);
        goto LAB_001067f1;
      case 0x68:
        uVar12 = 0;
        abuf_appendf(&log,"Usage: %s [OPTION]...\n%s%s%s",*argv,appdata->help_prefix);
        goto LAB_001067f1;
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x74:
      case 0x75:
switchD_0010661d_caseD_69:
        if ((!reload_only) && (_ignore_unknown != 1)) {
          abuf_appendf(&log,"Unknown parameter: \'%c\' (%d)\n",uVar3 & 0xffffffff,uVar3 & 0xffffffff
                      );
          if (log._len == 0) {
            uVar12 = 1;
            goto LAB_00106864;
          }
          uVar12 = 1;
          __stream = _stderr;
          goto LAB_0010685f;
        }
        break;
      case 0x6c:
        pcVar4 = oonf_cfg_get_instance();
        iVar1 = cfg_cmd_handle_load(pcVar4,pcVar2,_optarg,&log);
        goto LAB_0010675d;
      case 0x70:
        poVar5 = oonf_cfg_load_subsystem(_optarg);
        if (poVar5 != (oonf_subsystem *)0x0) {
          pcVar6 = oonf_cfg_get_rawdb();
          cfg_db_set_entry_ext(pcVar6,"global",0,"plugin",_optarg,1,1);
          break;
        }
        goto LAB_001067ec;
      case 0x71:
        oonf_cfg_exit();
        break;
      case 0x72:
        pcVar4 = oonf_cfg_get_instance();
        iVar1 = cfg_cmd_handle_remove(pcVar4,pcVar2,_optarg,&log);
        goto LAB_0010675d;
      case 0x73:
        pcVar4 = oonf_cfg_get_instance();
        iVar1 = cfg_cmd_handle_set(pcVar4,pcVar2,_optarg,&log);
LAB_0010675d:
        if (iVar1 != 0) {
LAB_001067ec:
          uVar12 = 1;
          goto LAB_001067f1;
        }
        break;
      case 0x76:
        oonf_log_printversion(&log);
        plVar8 = oonf_plugin_tree.list_head.prev;
        plVar14 = oonf_plugin_tree.list_head.next;
        if ((oonf_plugin_tree.list_head.next)->prev != oonf_plugin_tree.list_head.prev)
        goto LAB_001068fd;
        uVar12 = 0;
        goto LAB_001067f1;
      default:
        if (iVar1 != 1) {
          if (iVar1 == 0x53) {
            pcVar4 = oonf_cfg_get_instance();
            iVar1 = cfg_cmd_handle_save(pcVar4,pcVar2,_optarg,&log);
            goto LAB_0010675d;
          }
          goto switchD_0010661d_caseD_69;
        }
        if (_handle_unused_argument != (_func_int_char_ptr *)0x0) {
          (*_handle_unused_argument)(_optarg);
        }
      }
LAB_00106765:
      uVar3 = getopt_long(argc,argv,pcVar13,oonf_options);
      uVar11 = uVar3 >> 0x1f & 1;
      bVar10 = (byte)uVar11;
    } while (-1 < (int)uVar3);
    uVar12 = 0xffffffff;
  }
LAB_001067ab:
  p_Var9 = _handle_unused_argument;
  if ((_optind < argc & bVar10) == 1) {
    do {
      if (p_Var9 == (_func_int_char_ptr *)0x0) {
        p_Var9 = (_func_int_char_ptr *)0x0;
      }
      else {
        (*p_Var9)(argv[_optind]);
        p_Var9 = _handle_unused_argument;
      }
      _optind = _optind + 1;
    } while (_optind < argc);
  }
LAB_001067f1:
  if (log._len != 0) {
    if (reload_only) {
      if ((log_global_mask[1] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x26b,(void *)0x0,0,
                 "Cannot reload configuration.\n%s",log._buf);
      }
    }
    else {
      if (uVar12 == 0) {
        puVar7 = (undefined8 *)&stdout;
      }
      else {
        puVar7 = (undefined8 *)&stderr;
      }
      __stream = (FILE *)*puVar7;
LAB_0010685f:
      fputs(log._buf,__stream);
    }
  }
LAB_00106864:
  abuf_free(&log);
  return uVar12;
LAB_001068fd:
  do {
    if (plVar14[-1].next == (list_entity *)0x0) {
      abuf_appendf(&log,"Static plugin: %s\n",plVar14[-7].next);
      plVar8 = oonf_plugin_tree.list_head.prev;
    }
    plVar14 = plVar14->next;
  } while (plVar14->prev != plVar8);
  uVar12 = 0;
  goto LAB_001067ab;
}

Assistant:

static int
parse_commandline(int argc, char **argv, const struct oonf_appdata *appdata __attribute((unused)), bool reload_only) {
  struct oonf_subsystem *plugin;
  const char *parameters;
  struct autobuf log;
  struct cfg_db *db;
  int opt, opt_idx, return_code;

  return_code = -1;
  db = oonf_cfg_get_rawdb();

  /* reset getopt_long */
  opt_idx = -1;
  optind = 1;
  opterr = _ignore_unknown ? 0 : -1;

  abuf_init(&log);

  if (reload_only) {
    /* only parameters that load and change configuration data */
    parameters = "-p:l:s:r:f:n";
  }
  else {
    parameters = "-hvp:ql:S:s:r:g::f:n";
  }

  while (return_code == -1 && 0 <= (opt = getopt_long(argc, argv, parameters, oonf_options, &opt_idx))) {
    switch (opt) {
      case 'h':
#if !defined(REMOVE_HELPTEXT)
        abuf_appendf(
          &log, "Usage: %s [OPTION]...\n%s%s%s", argv[0], appdata->help_prefix, help_text, appdata->help_suffix);
#endif
        return_code = 0;
        break;

      case argv_option_debug_early:
      case argv_option_ignore_unknown:
        /* ignore this here */
        break;

      case 'v':
        oonf_log_printversion(&log);
        avl_for_each_element(&oonf_plugin_tree, plugin, _node) {
          if (!oonf_subsystem_is_dynamic(plugin)) {
            abuf_appendf(&log, "Static plugin: %s\n", plugin->name);
          }
        }
        return_code = 0;
        break;
      case 'p':
        if (oonf_cfg_load_subsystem(optarg) == NULL) {
          return_code = 1;
        }
        else {
          cfg_db_add_entry(oonf_cfg_get_rawdb(), CFG_SECTION_GLOBAL, NULL, CFG_GLOBAL_PLUGIN, optarg);
        }
        break;
      case 'q':
        oonf_cfg_exit();
        break;

      case argv_option_schema:
        _schema_name = optarg;
        _display_schema = true;
        break;

      case 'l':
        if (cfg_cmd_handle_load(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'S':
        if (cfg_cmd_handle_save(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 's':
        if (cfg_cmd_handle_set(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'r':
        if (cfg_cmd_handle_remove(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        break;
      case 'g':
        if (cfg_cmd_handle_get(oonf_cfg_get_instance(), db, optarg, &log)) {
          return_code = 1;
        }
        else {
          return_code = 0;
        }
        break;
      case 1:
        /* string that is not part of an option */
        if (_handle_unused_argument) {
          _handle_unused_argument(optarg);
        }
        break;

      case '?':
      default:
        if (!(reload_only || _ignore_unknown)) {
          abuf_appendf(&log, "Unknown parameter: '%c' (%d)\n", opt, opt);
          return_code = 1;
        }
        break;
    }
  }

  while (return_code == -1 && optind < argc) {
    /* handle the end of the command line */
    if (_handle_unused_argument) {
      _handle_unused_argument(argv[optind]);
    }
    optind++;
  }

  if (abuf_getlen(&log) > 0) {
    if (reload_only) {
      OONF_WARN(LOG_MAIN, "Cannot reload configuration.\n%s", abuf_getptr(&log));
    }
    else {
      fputs(abuf_getptr(&log), return_code == 0 ? stdout : stderr);
    }
  }

  abuf_free(&log);

  return return_code;
}